

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O0

void __thiscall GuiScope::GuiScope(GuiScope *this)

{
  GuiScope *this_local;
  
  IAutomation::IAutomation(&this->super_IAutomation);
  (this->super_IAutomation).super_IScope._vptr_IScope = (_func_int **)&PTR__GuiScope_002b8fe8;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
  ::unordered_map(&this->vars_);
  return;
}

Assistant:

GuiScope::GuiScope() {}